

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btHashedSimplePairCache.cpp
# Opt level: O0

btSimplePair * __thiscall
btHashedSimplePairCache::internalAddPair(btHashedSimplePairCache *this,int indexA,int indexB)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  uint in_EDX;
  uint in_ESI;
  btHashedSimplePairCache *in_RDI;
  int newCapacity;
  void *mem;
  int oldCapacity;
  int count;
  btSimplePair *pair;
  int hash;
  btAlignedObjectArray<btSimplePair> *in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffac;
  int in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffe0;
  btSimplePair *local_8;
  
  uVar1 = getHash(in_RDI,in_ESI,in_EDX);
  iVar2 = btAlignedObjectArray<btSimplePair>::capacity(&in_RDI->m_overlappingPairArray);
  uVar1 = uVar1 & iVar2 - 1U;
  local_8 = internalFindPair(in_RDI,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0,
                             in_stack_ffffffffffffffac);
  if (local_8 == (btSimplePair *)0x0) {
    iVar2 = btAlignedObjectArray<btSimplePair>::size(&in_RDI->m_overlappingPairArray);
    iVar3 = btAlignedObjectArray<btSimplePair>::capacity(&in_RDI->m_overlappingPairArray);
    local_8 = btAlignedObjectArray<btSimplePair>::expandNonInitializing(in_stack_ffffffffffffffa0);
    iVar4 = btAlignedObjectArray<btSimplePair>::capacity(&in_RDI->m_overlappingPairArray);
    if (iVar3 < iVar4) {
      growTables((btHashedSimplePairCache *)CONCAT44(uVar1,in_stack_ffffffffffffffe0));
      uVar1 = getHash(in_RDI,in_ESI,in_EDX);
      iVar3 = btAlignedObjectArray<btSimplePair>::capacity(&in_RDI->m_overlappingPairArray);
      uVar1 = uVar1 & iVar3 - 1U;
    }
    btSimplePair::btSimplePair(local_8,in_ESI,in_EDX);
    (local_8->field_2).m_userPointer = (void *)0x0;
    piVar5 = btAlignedObjectArray<int>::operator[](&in_RDI->m_hashTable,uVar1);
    iVar3 = *piVar5;
    piVar5 = btAlignedObjectArray<int>::operator[](&in_RDI->m_next,iVar2);
    *piVar5 = iVar3;
    piVar5 = btAlignedObjectArray<int>::operator[](&in_RDI->m_hashTable,uVar1);
    *piVar5 = iVar2;
  }
  return local_8;
}

Assistant:

btSimplePair* btHashedSimplePairCache::internalAddPair(int indexA, int indexB)
{

	int	hash = static_cast<int>(getHash(static_cast<unsigned int>(indexA),static_cast<unsigned int>(indexB)) & (m_overlappingPairArray.capacity()-1));	// New hash value with new mask


	btSimplePair* pair = internalFindPair(indexA, indexB, hash);
	if (pair != NULL)
	{
		return pair;
	}

	int count = m_overlappingPairArray.size();
	int oldCapacity = m_overlappingPairArray.capacity();
	void* mem = &m_overlappingPairArray.expandNonInitializing();

	int newCapacity = m_overlappingPairArray.capacity();

	if (oldCapacity < newCapacity)
	{
		growTables();
		//hash with new capacity
		hash = static_cast<int>(getHash(static_cast<unsigned int>(indexA),static_cast<unsigned int>(indexB)) & (m_overlappingPairArray.capacity()-1));
	}
	
	pair = new (mem) btSimplePair(indexA,indexB);

	pair->m_userPointer = 0;
	
	m_next[count] = m_hashTable[hash];
	m_hashTable[hash] = count;

	return pair;
}